

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O2

void raise_interrupt2(CPUX86State *env,int intno,int is_int,int error_code,int next_eip_addend,
                     uintptr_t retaddr)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  if (is_int == 0) {
    cpu_svm_check_intercept_param_x86_64(env,intno + 0x40,(long)error_code,retaddr);
    iVar1 = env->old_exception;
    bVar5 = intno != 0;
    bVar3 = 3 < intno - 10U;
    if (iVar1 == 8) {
      if ((env->hflags & 0x200000) != 0) {
        cpu_vmexit_x86_64(env,0x7f,0,retaddr);
      }
      qemu_system_reset_request((uc_struct *)env->uc);
      intno = 0x10001;
    }
    else {
      if (bVar5 && bVar3 || 3 < iVar1 - 10U && iVar1 != 0) {
        iVar2 = intno;
        if ((uint)intno < 0xf && iVar1 == 0xe) {
          bVar4 = (0x7c01U >> (intno & 0x1fU) & 1) != 0;
          if (bVar4) {
            error_code = 0;
          }
          iVar2 = 8;
          if (!bVar4) {
            iVar2 = intno;
          }
        }
      }
      else {
        error_code = 0;
        iVar2 = 8;
      }
      intno = iVar2;
      if ((!bVar5 || !bVar3) || (intno == 8 || intno == 0xe)) {
        env->old_exception = intno;
      }
    }
  }
  else {
    cpu_svm_check_intercept_param_x86_64(env,0x75,0,retaddr);
  }
  *(int *)((long)env[-1].hi16_zmm_regs + 0x3f0) = intno;
  env->error_code = error_code;
  env->exception_is_int = is_int;
  env->exception_next_eip = (long)next_eip_addend + env->eip;
  cpu_loop_exit_restore_x86_64((CPUState *)(env[-6].mtrr_var + 4),retaddr);
}

Assistant:

static void QEMU_NORETURN raise_interrupt2(CPUX86State *env, int intno,
                                           int is_int, int error_code,
                                           int next_eip_addend,
                                           uintptr_t retaddr)
{
    CPUState *cs = env_cpu(env);

    if (!is_int) {
        cpu_svm_check_intercept_param(env, SVM_EXIT_EXCP_BASE + intno,
                                      error_code, retaddr);
        intno = check_exception(env, intno, &error_code, retaddr);
    } else {
        cpu_svm_check_intercept_param(env, SVM_EXIT_SWINT, 0, retaddr);
    }

    cs->exception_index = intno;
    env->error_code = error_code;
    env->exception_is_int = is_int;
    env->exception_next_eip = env->eip + next_eip_addend;
    cpu_loop_exit_restore(cs, retaddr);
}